

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEnvironment::clearDeletionQueue(CGUIEnvironment *this)

{
  bool bVar1;
  u32 uVar2;
  IGUIElement **ppIVar3;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  uint uVar5;
  
  bVar1 = core::array<irr::gui::IGUIElement_*>::empty((array<irr::gui::IGUIElement_*> *)0x3acc7f);
  if (!bVar1) {
    uVar4 = 0;
    while (uVar5 = uVar4,
          uVar2 = core::array<irr::gui::IGUIElement_*>::size
                            ((array<irr::gui::IGUIElement_*> *)0x3accab), uVar4 < uVar2) {
      ppIVar3 = core::array<irr::gui::IGUIElement_*>::operator[]
                          ((array<irr::gui::IGUIElement_*> *)
                           CONCAT44(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      (*((*ppIVar3)->super_IEventReceiver)._vptr_IEventReceiver[9])();
      core::array<irr::gui::IGUIElement_*>::operator[]
                ((array<irr::gui::IGUIElement_*> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
      uVar4 = uVar5 + 1;
    }
    core::array<irr::gui::IGUIElement_*>::clear
              ((array<irr::gui::IGUIElement_*> *)CONCAT44(uVar5,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void CGUIEnvironment::clearDeletionQueue()
{
	if (DeletionQueue.empty())
		return;

	for (u32 i = 0; i < DeletionQueue.size(); ++i) {
		DeletionQueue[i]->remove();
		DeletionQueue[i]->drop();
	}

	DeletionQueue.clear();
}